

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O2

bool __thiscall
sisl::body_centered_cubic<char>::is_filled(body_centered_cubic<char> *this,int d0,__va_list_tag *vl)

{
  return true;
}

Assistant:

virtual bool is_lattice_site(int d0, va_list vl) const {
            int _x = d0, _y = 0, _z = 0;

            _y = va_arg(vl, int);
            _z = va_arg(vl, int);

            if((_z % 2)) {
                if((_y % 2) == 0 || (_x % 2) == 0) {
                    return false;
                }
            } else if((_y % 2) == 1 || (_x % 2) == 1) {
                return false;
            }
            return true;
        }